

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_chain_accept(llama_sampler *smpl,llama_token token)

{
  bool bVar1;
  long in_RDI;
  llama_sampler *smpl_1;
  iterator __end1;
  iterator __begin1;
  vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *__range1;
  time_meas tm;
  llama_sampler_chain *chain;
  undefined4 in_stack_ffffffffffffffa8;
  llama_token in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  int64_t *in_stack_ffffffffffffffb8;
  time_meas *in_stack_ffffffffffffffc0;
  __normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
  local_38;
  long local_30;
  long local_18;
  
  local_18 = *(long *)(in_RDI + 8);
  time_meas::time_meas
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
  local_30 = local_18 + 8;
  local_38._M_current =
       (llama_sampler **)
       std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::begin
                 ((vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *)
                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::end
            ((vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       (__normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
    ::operator*(&local_38);
    llama_sampler_accept
              ((llama_sampler *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    __gnu_cxx::
    __normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
    ::operator++(&local_38);
  }
  *(int *)(local_18 + 0x28) = *(int *)(local_18 + 0x28) + 1;
  time_meas::~time_meas((time_meas *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

static void llama_sampler_chain_accept(struct llama_sampler * smpl, llama_token token) {
    auto * chain = (llama_sampler_chain *) smpl->ctx;

    time_meas tm(chain->t_sample_us, chain->params.no_perf);

    for (auto * smpl : chain->samplers) {
        llama_sampler_accept(smpl, token);
    }

    chain->n_sample++;
}